

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>,false>
               (__normal_iterator<HighsGFkSolve::SolutionEntry_*,_std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>_>
                begin,__normal_iterator<HighsGFkSolve::SolutionEntry_*,_std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>_>
                      end,int param_3,byte param_4)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  SolutionEntry *pSVar4;
  SolutionEntry *pSVar5;
  SolutionEntry *pSVar6;
  __normal_iterator<HighsGFkSolve::SolutionEntry_*,_std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>_>
  _Var7;
  ulong uVar8;
  SolutionEntry *pSVar9;
  int iVar10;
  SolutionEntry SVar11;
  SolutionEntry SVar12;
  SolutionEntry SVar13;
  SolutionEntry SVar14;
  long lVar15;
  SolutionEntry SVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  SolutionEntry *pSVar20;
  _Iter_comp_iter<std::less<HighsGFkSolve::SolutionEntry>_> __cmp;
  _Iter_comp_iter<std::less<HighsGFkSolve::SolutionEntry>_> __cmp_1;
  _Iter_comp_iter<std::less<HighsGFkSolve::SolutionEntry>_> local_32;
  _Iter_comp_iter<std::less<HighsGFkSolve::SolutionEntry>_> local_31;
  
  uVar1 = (long)end._M_current - (long)begin._M_current >> 3;
  if ((long)uVar1 < 0x18) {
    if (param_4 == 0) {
LAB_002c8eae:
      pSVar6 = begin._M_current + 1;
      if (begin._M_current + 1 == end._M_current || begin._M_current == end._M_current) {
        return;
      }
      do {
        pSVar5 = pSVar6;
        if (begin._M_current[1].index < (begin._M_current)->index) {
          SVar14 = *pSVar5;
          pSVar6 = pSVar5;
          do {
            *pSVar6 = pSVar6[-1];
            pSVar9 = pSVar6 + -1;
            pSVar20 = pSVar6 + -2;
            pSVar6 = pSVar9;
          } while (SVar14.index < pSVar20->index);
          *pSVar9 = SVar14;
        }
        pSVar6 = pSVar5 + 1;
        begin._M_current = pSVar5;
      } while (pSVar5 + 1 != end._M_current);
      return;
    }
  }
  else {
    do {
      uVar8 = uVar1 >> 1;
      if (uVar1 < 0x81) {
        SVar14.weight = 0;
        SVar14.index = (begin._M_current)->index;
        if ((begin._M_current)->index < begin._M_current[uVar8].index) {
          SVar14 = begin._M_current[uVar8];
          begin._M_current[uVar8] = *begin._M_current;
          *begin._M_current = SVar14;
        }
        iVar10 = SVar14.index;
        if (end._M_current[-1].index < iVar10) {
          SVar14 = *begin._M_current;
          *begin._M_current = end._M_current[-1];
          end._M_current[-1] = SVar14;
          iVar10 = (begin._M_current)->index;
        }
        if (iVar10 < begin._M_current[uVar8].index) {
          SVar14 = begin._M_current[uVar8];
          begin._M_current[uVar8] = *begin._M_current;
          *begin._M_current = SVar14;
        }
      }
      else {
        SVar11.weight = 0;
        SVar11.index = begin._M_current[uVar8].index;
        if (begin._M_current[uVar8].index < (begin._M_current)->index) {
          SVar11 = *begin._M_current;
          *begin._M_current = begin._M_current[uVar8];
          begin._M_current[uVar8] = SVar11;
        }
        iVar10 = SVar11.index;
        if (end._M_current[-1].index < iVar10) {
          SVar14 = begin._M_current[uVar8];
          begin._M_current[uVar8] = end._M_current[-1];
          end._M_current[-1] = SVar14;
          iVar10 = begin._M_current[uVar8].index;
        }
        if (iVar10 < (begin._M_current)->index) {
          SVar14 = *begin._M_current;
          *begin._M_current = begin._M_current[uVar8];
          begin._M_current[uVar8] = SVar14;
        }
        SVar12.weight = 0;
        SVar12.index = begin._M_current[uVar8 - 1].index;
        if (begin._M_current[uVar8 - 1].index < begin._M_current[1].index) {
          SVar12 = begin._M_current[1];
          begin._M_current[1] = begin._M_current[uVar8 - 1];
          begin._M_current[uVar8 - 1] = SVar12;
        }
        iVar10 = SVar12.index;
        if (end._M_current[-2].index < iVar10) {
          SVar14 = begin._M_current[uVar8 - 1];
          begin._M_current[uVar8 - 1] = end._M_current[-2];
          end._M_current[-2] = SVar14;
          iVar10 = begin._M_current[uVar8 - 1].index;
        }
        if (iVar10 < begin._M_current[1].index) {
          SVar14 = begin._M_current[1];
          begin._M_current[1] = begin._M_current[uVar8 - 1];
          begin._M_current[uVar8 - 1] = SVar14;
        }
        SVar13.weight = 0;
        SVar13.index = begin._M_current[uVar8 + 1].index;
        if (begin._M_current[uVar8 + 1].index < begin._M_current[2].index) {
          SVar13 = begin._M_current[2];
          begin._M_current[2] = begin._M_current[uVar8 + 1];
          begin._M_current[uVar8 + 1] = SVar13;
        }
        if (end._M_current[-3].index < SVar13.index) {
          SVar14 = begin._M_current[uVar8 + 1];
          begin._M_current[uVar8 + 1] = end._M_current[-3];
          end._M_current[-3] = SVar14;
          SVar13.weight = 0;
          SVar13.index = begin._M_current[uVar8 + 1].index;
        }
        if (SVar13.index < begin._M_current[2].index) {
          SVar13 = begin._M_current[2];
          begin._M_current[2] = begin._M_current[uVar8 + 1];
          begin._M_current[uVar8 + 1] = SVar13;
        }
        iVar10 = begin._M_current[uVar8 - 1].index;
        SVar16.weight = 0;
        SVar16.index = begin._M_current[uVar8].index;
        SVar14 = begin._M_current[uVar8];
        SVar11 = SVar14;
        if (begin._M_current[uVar8].index < iVar10) {
          SVar11 = begin._M_current[uVar8 - 1];
          begin._M_current[uVar8 - 1] = SVar14;
          begin._M_current[uVar8] = SVar11;
          iVar10 = SVar14.index;
          SVar16 = SVar11;
        }
        SVar14 = SVar11;
        if (SVar13.index < SVar16.index) {
          SVar14 = begin._M_current[uVar8 + 1];
          begin._M_current[uVar8] = SVar14;
          begin._M_current[uVar8 + 1] = SVar11;
          SVar16 = SVar14;
        }
        SVar11 = SVar14;
        if (SVar16.index < iVar10) {
          SVar11 = begin._M_current[uVar8 - 1];
          begin._M_current[uVar8 - 1] = SVar14;
          begin._M_current[uVar8] = SVar11;
        }
        SVar14 = *begin._M_current;
        *begin._M_current = SVar11;
        begin._M_current[uVar8] = SVar14;
      }
      if ((param_4 & 1) == 0) {
        SVar14 = *begin._M_current;
        if (begin._M_current[-1].index < (begin._M_current)->index) goto LAB_002c8ad1;
        lVar2 = 0;
        do {
          lVar3 = lVar2;
          iVar10 = SVar14.index;
          lVar2 = lVar3 + -8;
        } while (iVar10 < *(int *)((long)&end._M_current[-1].index + lVar3));
        pSVar6 = (SolutionEntry *)((long)&end._M_current[-1].index + lVar3);
        _Var7._M_current = begin._M_current;
        if (lVar3 + -8 == -8) {
          do {
            pSVar5 = _Var7._M_current;
            if (pSVar6 <= _Var7._M_current) break;
            pSVar5 = _Var7._M_current + 1;
            pSVar9 = _Var7._M_current + 1;
            _Var7._M_current = pSVar5;
          } while (pSVar9->index <= iVar10);
        }
        else {
          do {
            pSVar5 = _Var7._M_current + 1;
            pSVar9 = _Var7._M_current + 1;
            _Var7._M_current = pSVar5;
          } while (pSVar9->index <= iVar10);
        }
        while (pSVar5 < pSVar6) {
          SVar11 = *pSVar5;
          *pSVar5 = *pSVar6;
          *pSVar6 = SVar11;
          pSVar9 = pSVar6;
          do {
            pSVar6 = pSVar9 + -1;
            pSVar20 = pSVar9 + -1;
            pSVar4 = pSVar5;
            pSVar9 = pSVar6;
          } while (iVar10 < pSVar20->index);
          do {
            pSVar9 = pSVar4 + 1;
            pSVar5 = pSVar4 + 1;
            pSVar4 = pSVar4 + 1;
          } while (pSVar9->index <= iVar10);
        }
        *begin._M_current = *pSVar6;
        *pSVar6 = SVar14;
        begin._M_current = pSVar6 + 1;
        uVar1 = (long)end._M_current - (long)begin._M_current >> 3;
      }
      else {
        SVar14 = *begin._M_current;
LAB_002c8ad1:
        lVar2 = 0;
        do {
          lVar3 = lVar2;
          lVar2 = lVar3 + 8;
          iVar10 = SVar14.index;
        } while (*(int *)((long)&begin._M_current[1].index + lVar3) < iVar10);
        pSVar6 = (SolutionEntry *)((long)&begin._M_current[1].index + lVar3);
        _Var7._M_current = end._M_current;
        if (lVar2 == 8) {
          do {
            pSVar5 = _Var7._M_current;
            if (_Var7._M_current <= pSVar6) break;
            pSVar5 = _Var7._M_current + -1;
            pSVar9 = _Var7._M_current + -1;
            _Var7._M_current = pSVar5;
          } while (iVar10 <= pSVar9->index);
        }
        else {
          do {
            pSVar5 = _Var7._M_current + -1;
            pSVar9 = _Var7._M_current + -1;
            _Var7._M_current = pSVar5;
          } while (iVar10 <= pSVar9->index);
        }
        pSVar9 = pSVar5;
        if (pSVar6 < pSVar5) {
          do {
            SVar11 = *(SolutionEntry *)((long)&(begin._M_current)->index + lVar2);
            *(SolutionEntry *)((long)&(begin._M_current)->index + lVar2) = *pSVar9;
            *pSVar9 = SVar11;
            do {
              lVar3 = lVar2;
              lVar2 = lVar3 + 8;
            } while (*(int *)((long)&begin._M_current[1].index + lVar3) < iVar10);
            do {
              pSVar4 = pSVar9 + -1;
              pSVar20 = pSVar9 + -1;
              pSVar9 = pSVar4;
            } while (iVar10 <= pSVar20->index);
          } while ((SolutionEntry *)((long)&begin._M_current[1].index + lVar3) < pSVar4);
        }
        pSVar9 = (SolutionEntry *)((long)&begin._M_current[-1].index + lVar2);
        pSVar20 = (SolutionEntry *)((long)&begin._M_current[-1].index + lVar2);
        pSVar4 = pSVar20 + 1;
        *begin._M_current = *pSVar20;
        *pSVar20 = SVar14;
        uVar8 = (long)pSVar9 - (long)begin._M_current >> 3;
        uVar18 = (long)end._M_current - (long)pSVar4 >> 3;
        if (((long)uVar8 < (long)(uVar1 >> 3)) || ((long)uVar18 < (long)(uVar1 >> 3))) {
          param_3 = param_3 + -1;
          if (param_3 == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<HighsGFkSolve::SolutionEntry>>>
                      (begin,end,&local_32);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<HighsGFkSolve::SolutionEntry>>>
                      (begin,end,&local_31);
            return;
          }
          if (0x17 < (long)uVar8) {
            uVar1 = uVar8 >> 2;
            SVar14 = *begin._M_current;
            *begin._M_current = begin._M_current[uVar1];
            begin._M_current[uVar1] = SVar14;
            SVar14 = pSVar9[-1];
            pSVar9[-1] = pSVar9[-uVar1];
            pSVar9[-uVar1] = SVar14;
            if (0x80 < uVar8) {
              SVar14 = begin._M_current[1];
              begin._M_current[1] = begin._M_current[uVar1 + 1];
              begin._M_current[uVar1 + 1] = SVar14;
              SVar14 = begin._M_current[2];
              begin._M_current[2] = begin._M_current[uVar1 + 2];
              begin._M_current[uVar1 + 2] = SVar14;
              SVar14 = pSVar9[-2];
              pSVar9[-2] = pSVar9[~uVar1];
              pSVar9[~uVar1] = SVar14;
              SVar14 = pSVar9[-3];
              pSVar9[-3] = pSVar9[-2 - uVar1];
              pSVar9[-2 - uVar1] = SVar14;
            }
          }
          if (0x17 < (long)uVar18) {
            uVar1 = uVar18 >> 2;
            SVar14 = pSVar9[1];
            pSVar9[1] = pSVar9[uVar1 + 1];
            pSVar9[uVar1 + 1] = SVar14;
            SVar14 = end._M_current[-1];
            end._M_current[-1] = end._M_current[-uVar1];
            end._M_current[-uVar1] = SVar14;
            if (0x80 < uVar18) {
              SVar14 = pSVar9[2];
              pSVar9[2] = pSVar9[uVar1 + 2];
              pSVar9[uVar1 + 2] = SVar14;
              SVar14 = pSVar9[3];
              pSVar9[3] = pSVar9[uVar1 + 3];
              pSVar9[uVar1 + 3] = SVar14;
              SVar14 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar1];
              end._M_current[~uVar1] = SVar14;
              SVar14 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar1];
              end._M_current[-2 - uVar1] = SVar14;
            }
          }
        }
        else if (pSVar5 <= pSVar6) {
          if ((lVar2 - 8U & 0xfffffffffffffff7) != 0) {
            lVar3 = 8;
            uVar1 = 0;
            pSVar6 = begin._M_current + 1;
            _Var7._M_current = begin._M_current;
            do {
              pSVar5 = pSVar6;
              if (_Var7._M_current[1].index < (_Var7._M_current)->index) {
                SVar14 = _Var7._M_current[1];
                lVar15 = lVar3;
                do {
                  lVar17 = lVar15;
                  *(undefined8 *)((long)&(begin._M_current)->index + lVar17) =
                       *(undefined8 *)((long)&begin._M_current[-1].index + lVar17);
                  _Var7._M_current = begin._M_current;
                  if (lVar17 == 8) goto LAB_002c8c1e;
                  lVar15 = lVar17 + -8;
                } while (SVar14.index < *(int *)((long)&begin._M_current[-2].index + lVar17));
                _Var7._M_current = (SolutionEntry *)((long)&begin._M_current[-1].index + lVar17);
LAB_002c8c1e:
                *_Var7._M_current = SVar14;
                uVar1 = uVar1 + ((long)pSVar5 - (long)_Var7._M_current >> 3);
                if (8 < uVar1) goto LAB_002c8e23;
              }
              lVar3 = lVar3 + 8;
              pSVar6 = pSVar5 + 1;
              _Var7._M_current = pSVar5;
            } while (pSVar5 + 1 != pSVar9);
          }
          if (pSVar4 == end._M_current) {
            return;
          }
          if (pSVar9 + 2 == end._M_current) {
            return;
          }
          lVar3 = 0x10;
          lVar15 = 0;
          uVar1 = 0;
          pSVar6 = pSVar4;
          do {
            pSVar5 = (SolutionEntry *)((long)&pSVar9->index + lVar3);
            if (*(int *)((long)&pSVar9->index + lVar3) < pSVar6->index) {
              SVar14 = *pSVar5;
              lVar17 = lVar15;
              do {
                lVar19 = lVar17;
                *(undefined8 *)((long)&pSVar9[2].index + lVar19) =
                     *(undefined8 *)((long)&pSVar9[1].index + lVar19);
                pSVar6 = pSVar4;
                pSVar20 = pSVar4;
                if (lVar19 == 0) goto LAB_002c8cb8;
                lVar17 = lVar19 + -8;
              } while (SVar14.index < *(int *)((long)&pSVar9->index + lVar19));
              pSVar6 = (SolutionEntry *)((long)&(begin._M_current)->index + lVar2 + lVar19);
              pSVar20 = (SolutionEntry *)((long)&pSVar9[1].index + lVar19);
LAB_002c8cb8:
              *pSVar20 = SVar14;
              uVar1 = uVar1 + ((long)pSVar5 - (long)pSVar6 >> 3);
              if (8 < uVar1) break;
            }
            pSVar20 = (SolutionEntry *)((long)&pSVar9[1].index + lVar3);
            lVar3 = lVar3 + 8;
            lVar15 = lVar15 + 8;
            pSVar6 = pSVar5;
            if (pSVar20 == end._M_current) {
              return;
            }
          } while( true );
        }
LAB_002c8e23:
        pdqsort_loop<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>,false>
                  (begin._M_current,pSVar9,param_3);
        param_4 = 0;
        uVar1 = uVar18;
        begin._M_current = pSVar4;
      }
    } while (0x17 < (long)uVar1);
    if ((param_4 & 1) == 0) goto LAB_002c8eae;
  }
  if (begin._M_current + 1 != end._M_current && begin._M_current != end._M_current) {
    lVar2 = 8;
    pSVar6 = begin._M_current;
    pSVar5 = begin._M_current + 1;
    do {
      if (pSVar6[1].index < pSVar6->index) {
        SVar14 = *pSVar5;
        lVar3 = lVar2;
        do {
          lVar15 = lVar3;
          *(undefined8 *)((long)&(begin._M_current)->index + lVar15) =
               *(undefined8 *)((long)&begin._M_current[-1].index + lVar15);
          pSVar6 = begin._M_current;
          if (lVar15 == 8) goto LAB_002c8908;
          lVar3 = lVar15 + -8;
        } while (SVar14.index < *(int *)((long)&begin._M_current[-2].index + lVar15));
        pSVar6 = (SolutionEntry *)((long)&begin._M_current[-1].index + lVar15);
LAB_002c8908:
        *pSVar6 = SVar14;
      }
      pSVar9 = pSVar5 + 1;
      lVar2 = lVar2 + 8;
      pSVar6 = pSVar5;
      pSVar5 = pSVar9;
    } while (pSVar9 != end._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }